

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O3

void device_reset_iremga20(void *info)

{
  *(undefined8 *)((long)info + 0x3d) = 0;
  *(undefined8 *)((long)info + 0x45) = 0;
  *(undefined8 *)((long)info + 0x34) = 0;
  *(undefined8 *)((long)info + 0x3c) = 0;
  *(undefined8 *)((long)info + 0x50) = 0;
  *(undefined8 *)((long)info + 0x58) = 0;
  *(undefined8 *)((long)info + 0x59) = 0;
  *(undefined8 *)((long)info + 0x61) = 0;
  *(undefined8 *)((long)info + 0x6c) = 0;
  *(undefined8 *)((long)info + 0x74) = 0;
  *(undefined8 *)((long)info + 0x75) = 0;
  *(undefined8 *)((long)info + 0x7d) = 0;
  *(undefined8 *)((long)info + 0x88) = 0;
  *(undefined8 *)((long)info + 0x90) = 0;
  *(undefined8 *)((long)info + 0x91) = 0;
  *(undefined8 *)((long)info + 0x99) = 0;
  *(undefined8 *)((long)info + 0x14) = 0;
  *(undefined8 *)((long)info + 0x1c) = 0;
  *(undefined8 *)((long)info + 0x24) = 0;
  *(undefined8 *)((long)info + 0x2c) = 0;
  return;
}

Assistant:

static void device_reset_iremga20(void *info)
{
	ga20_state *chip = (ga20_state *)info;
	int i;

	for( i = 0; i < 4; i++ ) {
		chip->channel[i].start = 0;
		chip->channel[i].end = 0;
		chip->channel[i].pos = 0;
		chip->channel[i].frac = 0;
		chip->channel[i].fracrate = 0;
		chip->channel[i].volume = 0;
		chip->channel[i].rate = 0;
		chip->channel[i].counter = 0;
		chip->channel[i].play = 0;
	}

	memset(chip->regs, 0x00, 0x20 * sizeof(UINT8));
}